

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_mask_table_set_bits
                   (PS_Mask_Table table,FT_Byte *source,FT_UInt bit_pos,FT_UInt bit_count,
                   FT_Memory memory)

{
  byte local_58;
  int local_54;
  FT_Int val;
  FT_Int wmask;
  FT_Byte *write;
  byte *pbStack_40;
  FT_Int rmask;
  FT_Byte *read;
  PS_Mask mask;
  FT_Memory pFStack_28;
  FT_Error error;
  FT_Memory memory_local;
  FT_UInt bit_count_local;
  FT_UInt bit_pos_local;
  FT_Byte *source_local;
  PS_Mask_Table table_local;
  
  pFStack_28 = memory;
  memory_local._0_4_ = bit_count;
  memory_local._4_4_ = bit_pos;
  _bit_count_local = source;
  source_local = (FT_Byte *)table;
  mask._4_4_ = ps_mask_table_last(table,memory,(PS_Mask *)&read);
  if ((mask._4_4_ == 0) &&
     (mask._4_4_ = ps_mask_ensure((PS_Mask)read,(FT_UInt)memory_local,pFStack_28), mask._4_4_ == 0))
  {
    *(FT_UInt *)read = (FT_UInt)memory_local;
    pbStack_40 = _bit_count_local + (memory_local._4_4_ >> 3);
    write._4_4_ = 0x80 >> ((byte)memory_local._4_4_ & 7);
    _val = *(byte **)(read + 8);
    local_54 = 0x80;
    for (; (FT_UInt)memory_local != 0; memory_local._0_4_ = (FT_UInt)memory_local - 1) {
      local_58 = *_val & ((byte)local_54 ^ 0xff);
      if ((*pbStack_40 & write._4_4_) != 0) {
        local_58 = (byte)local_54 | local_58;
      }
      *_val = local_58;
      write._4_4_ = (int)write._4_4_ >> 1;
      if (write._4_4_ == 0) {
        pbStack_40 = pbStack_40 + 1;
        write._4_4_ = 0x80;
      }
      local_54 = local_54 >> 1;
      if (local_54 == 0) {
        _val = _val + 1;
        local_54 = 0x80;
      }
    }
  }
  return mask._4_4_;
}

Assistant:

static FT_Error
  ps_mask_table_set_bits( PS_Mask_Table   table,
                          const FT_Byte*  source,
                          FT_UInt         bit_pos,
                          FT_UInt         bit_count,
                          FT_Memory       memory )
  {
    FT_Error  error;
    PS_Mask   mask;


    error = ps_mask_table_last( table, memory, &mask );
    if ( error )
      goto Exit;

    error = ps_mask_ensure( mask, bit_count, memory );
    if ( error )
      goto Exit;

    mask->num_bits = bit_count;

    /* now, copy bits */
    {
      FT_Byte*  read  = (FT_Byte*)source + ( bit_pos >> 3 );
      FT_Int    rmask = 0x80 >> ( bit_pos & 7 );
      FT_Byte*  write = mask->bytes;
      FT_Int    wmask = 0x80;
      FT_Int    val;


      for ( ; bit_count > 0; bit_count-- )
      {
        val = write[0] & ~wmask;

        if ( read[0] & rmask )
          val |= wmask;

        write[0] = (FT_Byte)val;

        rmask >>= 1;
        if ( rmask == 0 )
        {
          read++;
          rmask = 0x80;
        }

        wmask >>= 1;
        if ( wmask == 0 )
        {
          write++;
          wmask = 0x80;
        }
      }
    }

  Exit:
    return error;
  }